

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

idx_t duckdb::TemplatedUpdateNumericStatistics<signed_char>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  undefined4 uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  idx_t iVar5;
  idx_t iVar6;
  data_t dVar7;
  data_t dVar8;
  idx_t iVar9;
  data_t dVar10;
  
  pdVar2 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      iVar5 = 0;
      do {
        psVar3 = update->sel->sel_vector;
        iVar6 = iVar5;
        if (psVar3 != (sel_t *)0x0) {
          iVar6 = (idx_t)psVar3[iVar5];
        }
        dVar7 = pdVar2[iVar6];
        dVar8 = (data_t)*(undefined4 *)((long)&(stats->statistics).stats_union + 8);
        if ((char)dVar7 <= (char)dVar8) {
          dVar8 = dVar7;
        }
        uVar1 = *(undefined4 *)((long)&(stats->statistics).stats_union + 0x18);
        (stats->statistics).stats_union.string_data.max[0] = dVar8;
        dVar8 = (data_t)uVar1;
        if ((char)dVar8 <= (char)dVar7) {
          dVar8 = dVar7;
        }
        *(data_t *)((long)&(stats->statistics).stats_union + 0x18) = dVar8;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    this = (sel->selection_data).internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    sel->sel_vector = (sel_t *)0x0;
    iVar5 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    if (count == 0) {
      iVar5 = 0;
    }
    else {
      iVar6 = 0;
      iVar5 = 0;
      do {
        psVar3 = update->sel->sel_vector;
        iVar9 = iVar6;
        if (psVar3 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar3[iVar6];
        }
        puVar4 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) {
          sel->sel_vector[iVar5] = (sel_t)iVar6;
          iVar5 = iVar5 + 1;
          dVar7 = pdVar2[iVar9];
          dVar8 = (data_t)*(undefined4 *)((long)&(stats->statistics).stats_union + 0x18);
          dVar10 = (data_t)*(undefined4 *)((long)&(stats->statistics).stats_union + 8);
          if ((char)dVar7 <= (char)dVar10) {
            dVar10 = dVar7;
          }
          (stats->statistics).stats_union.string_data.max[0] = dVar10;
          if ((char)dVar7 < (char)dVar8) {
            dVar7 = dVar8;
          }
          *(data_t *)((long)&(stats->statistics).stats_union + 0x18) = dVar7;
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  return iVar5;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}